

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::execute_cfunction(Forth *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  _Var2 = this->executingWord;
  p_Var1 = &(this->cfunctions)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->cfunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar5]) {
    bVar5 = p_Var4[1]._M_color < _Var2;
    if (!bVar5) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, _Var2 < p_Var3[1]._M_color)) {
    p_Var4 = &p_Var1->_M_header;
  }
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var4[1]._M_parent != (_Base_ptr)0x0)) {
    (*(code *)p_Var4[1]._M_parent)();
    return;
  }
  return;
}

Assistant:

void execute_cfunction(){
			auto num = executingWord;
			auto finded = cfunctions.find(num) ;
			if (finded != cfunctions.end()){
				auto function = finded->second;
				if(function)
					function(this);
			}
		}